

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O2

void tonk_socket_destroy(TonkSocket tonkSocket,uint32_t shouldBlock)

{
  ApplicationSession *session;
  thread tStack_18;
  ApplicationSession *local_10;
  
  if (tonkSocket != (TonkSocket)0x0) {
    local_10 = (ApplicationSession *)tonkSocket;
    if (shouldBlock != 0) {
      destroy_session((ApplicationSession *)tonkSocket);
      return;
    }
    std::thread::thread<void(&)(tonk::ApplicationSession*),tonk::ApplicationSession*&,void>
              (&tStack_18,destroy_session,&local_10);
    std::thread::detach();
    std::thread::~thread(&tStack_18);
  }
  return;
}

Assistant:

TONK_EXPORT void tonk_socket_destroy(
    TonkSocket tonkSocket, ///< [in] Socket to shutdown
    uint32_t shouldBlock   ///< [in] Boolean: Should this function block?
)
{
    auto session = reinterpret_cast<ApplicationSession*>(tonkSocket);
    if (session)
    {
        if (shouldBlock) {
            destroy_session(session);
        }
        else {
            std::thread(destroy_session, session).detach();
        }
    }
}